

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O0

void __thiscall ForbiddenPointFinder::clear(ForbiddenPointFinder *this)

{
  int local_1c;
  int local_18;
  int j;
  int i_1;
  int i;
  ForbiddenPointFinder *this_local;
  
  this->nForbiddenPoints = 0;
  for (j = 0; j < 0x11; j = j + 1) {
    this->cBoard[0][j] = Wall;
    this->cBoard[0x10][j] = Wall;
    this->cBoard[j][0] = Wall;
    this->cBoard[j][0x10] = Wall;
  }
  for (local_18 = 1; local_18 < 0x10; local_18 = local_18 + 1) {
    for (local_1c = 1; local_1c < 0x10; local_1c = local_1c + 1) {
      this->cBoard[local_18][local_1c] = Empty;
    }
  }
  return;
}

Assistant:

void ForbiddenPointFinder::clear() {
    nForbiddenPoints = 0;

    for (int i = 0; i < BoardSize + 2; i++) {
        cBoard[0][i] = Stone ::Wall;
        cBoard[(BoardSize + 1)][i] = Stone ::Wall;
        cBoard[i][0] = Stone ::Wall;
        cBoard[i][(BoardSize + 1)] = Stone ::Wall;
    }

    for (int i = 1; i <= BoardSize; i++)
        for (int j = 1; j <= BoardSize; j++)
            cBoard[i][j] = Stone::Empty;
}